

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O1

QString * __thiscall QTemporaryFile::fileName(QString *__return_storage_ptr__,QTemporaryFile *this)

{
  QTemporaryFilePrivate *this_00;
  _Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_> _Var1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  
  this_00 = (QTemporaryFilePrivate *)
            (this->super_QFile).super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d;
  _Var1.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
       (this_00->super_QFilePrivate).super_QFileDevicePrivate.fileEngine._M_t.
       super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
       super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
       super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
  if ((_Var1.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl !=
       (QAbstractFileEngine *)0x0) &&
     ((lVar2 = *(long *)((long)_Var1.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                               _M_head_impl + 8), *(long *)(lVar2 + 0xa8) != 0 ||
      (*(int *)(lVar2 + 0xb8) != -1)))) {
    QTemporaryFilePrivate::materializeUnnamedFile(this_00);
  }
  if ((this_00->super_QFilePrivate).fileName.d.size == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    iVar3 = (*(this_00->super_QFilePrivate).super_QFileDevicePrivate.super_QIODevicePrivate.
              super_QObjectPrivate.super_QObjectData._vptr_QObjectData[7])(this_00);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 200))
              (__return_storage_ptr__,(long *)CONCAT44(extraout_var,iVar3),0);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QTemporaryFile::fileName() const
{
    Q_D(const QTemporaryFile);
    auto tef = static_cast<QTemporaryFileEngine *>(d->fileEngine.get());
    if (tef && tef->isReallyOpen())
        const_cast<QTemporaryFilePrivate *>(d)->materializeUnnamedFile();

    if (d->fileName.isEmpty())
        return QString();
    return d->engine()->fileName(QAbstractFileEngine::DefaultName);
}